

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O3

void Abc_WriteMulti(FILE *pFile,int nVars)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  
  uVar12 = (ulong)(uint)nVars;
  if (1 < (uint)nVars) {
    uVar12 = 0;
    uVar4 = nVars - 1;
    do {
      uVar12 = (ulong)((int)uVar12 + 1);
      bVar1 = 9 < uVar4;
      uVar4 = uVar4 / 10;
    } while (bVar1);
  }
  if (nVars != 0) {
    uVar4 = nVars * 2;
    uVar5 = (ulong)(uVar4 - 1);
    uVar9 = 0;
    do {
      uVar6 = (uint)uVar5;
      uVar5 = uVar5 / 10;
      uVar8 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar8;
    } while (9 < uVar6);
    if (0 < nVars) {
      fprintf((FILE *)pFile,".model Multi%d\n",(ulong)(uint)nVars);
      fwrite(".inputs",7,1,(FILE *)pFile);
      uVar5 = 0;
      do {
        fprintf((FILE *)pFile," a%0*d",uVar12,uVar5);
        uVar6 = (int)uVar5 + 1;
        uVar5 = (ulong)uVar6;
      } while (nVars != uVar6);
      uVar6 = 0;
      do {
        fprintf((FILE *)pFile," b%0*d",uVar12,(ulong)uVar6);
        uVar6 = uVar6 + 1;
      } while (nVars != uVar6);
      fputc(10,(FILE *)pFile);
      fwrite(".outputs",8,1,(FILE *)pFile);
      uVar6 = 1;
      if (1 < (int)uVar4) {
        uVar6 = uVar4;
      }
      uVar5 = 0;
      do {
        fprintf((FILE *)pFile," m%0*d",uVar9,uVar5);
        uVar7 = (int)uVar5 + 1;
        uVar5 = (ulong)uVar7;
      } while (uVar6 != uVar7);
      fputc(10,(FILE *)pFile);
      uVar7 = 0;
      do {
        fprintf((FILE *)pFile,".names x%0*d_%0*d\n",uVar12,0,(ulong)uVar8,(ulong)uVar7);
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
      uVar7 = 0;
      if (0 < (int)uVar4) {
        uVar7 = uVar4;
      }
      iVar3 = 0;
      uVar5 = 0;
      do {
        uVar2 = (uint)uVar5;
        uVar11 = 0;
        do {
          uVar10 = (uint)uVar11;
          if ((int)uVar10 < (int)(uVar2 + nVars) && uVar2 <= uVar10) {
            fprintf((FILE *)pFile,".names b%0*d a%0*d y%0*d_%0*d\n11 1\n",uVar12,uVar5,uVar12,
                    (ulong)(iVar3 + uVar10),uVar12,uVar5,uVar9,uVar11);
          }
          else {
            fprintf((FILE *)pFile,".names y%0*d_%0*d\n",uVar12,uVar5,(ulong)uVar8,uVar11);
          }
          uVar11 = (ulong)(uVar10 + 1);
        } while (uVar6 != uVar10 + 1);
        uVar11 = 0;
        fprintf((FILE *)pFile,".subckt ADD%d",(ulong)uVar4);
        do {
          fprintf((FILE *)pFile," a%0*d=x%0*d_%0*d",(ulong)uVar8,uVar11,uVar12,uVar5,uVar9,uVar11);
          uVar10 = (int)uVar11 + 1;
          uVar11 = (ulong)uVar10;
        } while (uVar6 != uVar10);
        uVar11 = 0;
        do {
          fprintf((FILE *)pFile," b%0*d=y%0*d_%0*d",uVar9,uVar11,uVar12,uVar5,uVar9,uVar11);
          uVar10 = (int)uVar11 + 1;
          uVar11 = (ulong)uVar10;
        } while (uVar6 != uVar10);
        uVar5 = (ulong)(uVar2 + 1);
        uVar11 = 0;
        do {
          fprintf((FILE *)pFile," s%0*d=x%0*d_%0*d",(ulong)uVar8,uVar11,uVar12,uVar5,uVar9,uVar11);
          uVar10 = (int)uVar11 + 1;
          uVar11 = (ulong)uVar10;
        } while (uVar7 + 1 != uVar10);
        fputc(10,(FILE *)pFile);
        iVar3 = iVar3 + -1;
      } while (uVar2 + 1 != nVars);
      uVar6 = 1;
      if (1 < (int)uVar4) {
        uVar6 = uVar4;
      }
      uVar5 = 0;
      do {
        fprintf((FILE *)pFile,".names x%0*d_%0*d m%0*d\n1 1\n",uVar12,(ulong)(uint)nVars,
                (ulong)uVar8,uVar5,uVar9,uVar5);
        uVar7 = (int)uVar5 + 1;
        uVar5 = (ulong)uVar7;
      } while (uVar6 != uVar7);
      fwrite(".end\n",5,1,(FILE *)pFile);
      fputc(10,(FILE *)pFile);
      Abc_WriteAdder(pFile,uVar4);
      return;
    }
  }
  __assert_fail("nVars > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcGen.c"
                ,0x90,"void Abc_WriteMulti(FILE *, int)");
}

Assistant:

void Abc_WriteMulti( FILE * pFile, int nVars )
{
    int i, k, nDigits = Abc_Base10Log( nVars ), nDigits2 = Abc_Base10Log( 2*nVars );

    assert( nVars > 0 );
    fprintf( pFile, ".model Multi%d\n", nVars );

    fprintf( pFile, ".inputs" );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " a%0*d", nDigits, i );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " b%0*d", nDigits, i );
    fprintf( pFile, "\n" );

    fprintf( pFile, ".outputs" );
    for ( i = 0; i < 2*nVars; i++ )
        fprintf( pFile, " m%0*d", nDigits2, i );
    fprintf( pFile, "\n" );

    for ( i = 0; i < 2*nVars; i++ )
        fprintf( pFile, ".names x%0*d_%0*d\n", nDigits, 0, nDigits2, i );
    for ( k = 0; k < nVars; k++ )
    {
        for ( i = 0; i < 2 * nVars; i++ )
            if ( i >= k && i < k + nVars )
                fprintf( pFile, ".names b%0*d a%0*d y%0*d_%0*d\n11 1\n", nDigits, k, nDigits, i-k, nDigits, k, nDigits2, i );
            else
                fprintf( pFile, ".names y%0*d_%0*d\n", nDigits, k, nDigits2, i );
        fprintf( pFile, ".subckt ADD%d", 2*nVars );
        for ( i = 0; i < 2*nVars; i++ )
            fprintf( pFile, " a%0*d=x%0*d_%0*d", nDigits2, i, nDigits, k, nDigits2, i );
        for ( i = 0; i < 2*nVars; i++ )
            fprintf( pFile, " b%0*d=y%0*d_%0*d", nDigits2, i, nDigits, k, nDigits2, i );
        for ( i = 0; i <= 2*nVars; i++ )
            fprintf( pFile, " s%0*d=x%0*d_%0*d", nDigits2, i, nDigits, k+1, nDigits2, i );
        fprintf( pFile, "\n" );
    }
    for ( i = 0; i < 2 * nVars; i++ )
        fprintf( pFile, ".names x%0*d_%0*d m%0*d\n1 1\n", nDigits, k, nDigits2, i, nDigits2, i );
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" );
    Abc_WriteAdder( pFile, 2*nVars );
}